

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

bool parse_address(char *cstr_addr,sockaddr_in *addr)

{
  ulong __n;
  size_t __n_00;
  sockaddr_in sVar1;
  string str_addr;
  char strip [1000];
  char strport [1000];
  undefined1 *local_828;
  long local_820;
  undefined1 local_818 [16];
  allocator local_808 [1008];
  char local_418 [1000];
  
  std::__cxx11::string::string((string *)&local_828,cstr_addr,local_808);
  __n = std::__cxx11::string::find((char)&local_828,0x3a);
  if (__n == 0xffffffffffffffff) {
    parse_address();
  }
  else {
    __n_00 = ~__n + local_820;
    fprintf(_stderr,"%ld %ld %ld\n",__n,__n + 1,__n_00);
    strncpy((char *)local_808,cstr_addr,__n);
    local_808[__n] = (allocator)0x0;
    strncpy(local_418,cstr_addr + __n + 1,__n_00);
    local_418[__n_00] = '\0';
    sVar1 = get_address((char *)local_808,local_418);
    *addr = sVar1;
  }
  if (local_828 != local_818) {
    operator_delete(local_828);
  }
  return __n != 0xffffffffffffffff;
}

Assistant:

bool parse_address(char* cstr_addr, struct sockaddr_in &addr) {
    std::string str_addr(cstr_addr);
    size_t pos = str_addr.find(':');
    size_t len = str_addr.size();
    if (pos == std::string::npos) {
        fprintf(stderr, "Bad string\n");
        return false;
    }

    char strip[1000];
    char strport[1000];
    fprintf(stderr, "%ld %ld %ld\n", pos, pos + 1, len - pos - 1);
    strncpy(strip, cstr_addr, pos);
    strip[pos] = '\0';
    strncpy(strport, cstr_addr + pos + 1, len - pos - 1);
    strport[len - pos - 1] = '\0';

    addr = get_address(strip, strport);
    return true;
}